

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O3

void __thiscall CVmBigNumCache::release_all(CVmBigNumCache *this)

{
  CVmBigNumCacheReg *pCVar1;
  ulong uVar2;
  CVmBigNumCacheReg *pCVar3;
  
  if (this->max_regs_ != 0) {
    uVar2 = 0;
    pCVar3 = this->free_reg_;
    do {
      pCVar1 = this->reg_ + (uVar2 & 0xffffffff);
      pCVar1->nxt_ = pCVar3;
      this->free_reg_ = pCVar1;
      uVar2 = uVar2 + 1;
      pCVar3 = pCVar1;
    } while (uVar2 < this->max_regs_);
  }
  return;
}

Assistant:

void CVmBigNumCache::release_all()
{
    size_t i;

    /* mark each of our registers as not in use */
    for (i = 0 ; i < max_regs_ ; ++i)
        release_reg(i);
}